

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::PhpName
                   (string *__return_storage_ptr__,string *full_name,Options *options)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_48;
  bool local_42;
  undefined1 local_41;
  int i;
  bool cap_next_letter;
  string segment;
  Options *options_local;
  string *full_name_local;
  string *result;
  
  segment.field_2._8_8_ = options;
  if ((options->is_descriptor & 1U) == 0) {
    std::__cxx11::string::string((string *)&i);
    local_41 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_42 = true;
    for (local_48 = 0; uVar2 = (ulong)local_48, uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
        local_48 = local_48 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
      if (((*pcVar4 < 'a') ||
          (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)full_name), 'z' < *pcVar4)) ||
         ((local_42 & 1U) == 0)) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
        cVar1 = *pcVar4;
        if (cVar1 != '.') {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
          std::__cxx11::string::operator+=((string *)&i,*pcVar4);
        }
        else {
          ClassNamePrefix(&local_b8,(string *)&i);
          std::operator+(&local_98,&local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
          std::operator+(&local_78,&local_98,'\\');
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::operator=((string *)&i,"");
        }
        local_42 = cVar1 == '.';
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
        std::__cxx11::string::operator+=((string *)&i,*pcVar4 + -0x20);
        local_42 = false;
      }
    }
    ClassNamePrefix(&local_f8,(string *)&i);
    std::operator+(&local_d8,&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    local_41 = 1;
    std::__cxx11::string::~string((string *)&i);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&kDescriptorPackageName_abi_cxx11_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpName(const std::string& full_name, const Options& options) {
  if (options.is_descriptor) {
    return kDescriptorPackageName;
  }

  std::string segment;
  std::string result;
  bool cap_next_letter = true;
  for (int i = 0; i < full_name.size(); i++) {
    if ('a' <= full_name[i] && full_name[i] <= 'z' && cap_next_letter) {
      segment += full_name[i] + ('A' - 'a');
      cap_next_letter = false;
    } else if (full_name[i] == '.') {
      result += ClassNamePrefix(segment) + segment + '\\';
      segment = "";
      cap_next_letter = true;
    } else {
      segment += full_name[i];
      cap_next_letter = false;
    }
  }
  result += ClassNamePrefix(segment) + segment;
  return result;
}